

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O2

OffsetData * QTimeZonePrivate::toOffsetData(OffsetData *__return_storage_ptr__,Data *data)

{
  int iVar1;
  long in_FS_OFFSET;
  Data local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QArrayDataPointer<char16_t>::QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)__return_storage_ptr__,
             (QArrayDataPointer<char16_t> *)data);
  local_20 = (Data)0x2;
  QDateTime::fromMSecsSinceEpoch
            (&__return_storage_ptr__->atUtc,data->atMSecsSinceEpoch,(QTimeZone *)&local_20.s);
  iVar1 = data->standardTimeOffset;
  __return_storage_ptr__->offsetFromUtc = data->offsetFromUtc;
  __return_storage_ptr__->standardTimeOffset = iVar1;
  __return_storage_ptr__->daylightTimeOffset = data->daylightTimeOffset;
  QTimeZone::~QTimeZone((QTimeZone *)&local_20.s);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QTimeZone::OffsetData QTimeZonePrivate::toOffsetData(const QTimeZonePrivate::Data &data)
{
    if (data.atMSecsSinceEpoch == invalidMSecs())
        return invalidOffsetData();

    return {
        data.abbreviation,
        QDateTime::fromMSecsSinceEpoch(data.atMSecsSinceEpoch, QTimeZone::UTC),
        data.offsetFromUtc, data.standardTimeOffset, data.daylightTimeOffset };
}